

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_cpp03.hpp
# Opt level: O3

string * __thiscall
lest::string_maker<std::byte>::to_string_abi_cxx11_
          (string *__return_storage_ptr__,string_maker<std::byte> *this,byte *value)

{
  uint *puVar1;
  string_maker<std::byte> sVar2;
  ostream *poVar3;
  ostringstream os;
  long local_198 [3];
  uint auStack_180 [22];
  ios_base local_128 [264];
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_198);
  puVar1 = (uint *)((long)auStack_180 + *(long *)(local_198[0] + -0x18));
  *puVar1 = *puVar1 | 1;
  sVar2 = *this;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,"[byte:",6);
  *(uint *)((long)auStack_180 + *(long *)(local_198[0] + -0x18)) =
       *(uint *)((long)auStack_180 + *(long *)(local_198[0] + -0x18)) & 0xffffffb5 | 8;
  puVar1 = (uint *)((long)auStack_180 + *(long *)(local_198[0] + -0x18));
  *puVar1 = *puVar1 | 0x200;
  poVar3 = (ostream *)std::ostream::operator<<((ostream *)local_198,(uint)(byte)sVar2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"]",1);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_198);
  std::ios_base::~ios_base(local_128);
  return __return_storage_ptr__;
}

Assistant:

static std::string to_string( T const & value )
    {
        std::ostringstream os; os << std::boolalpha << value;
        return os.str();
    }